

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void Am_Stepping_Animator_Animation_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  unsigned_long uVar3;
  Am_Value *pAVar4;
  Am_Value *pAVar5;
  Am_Value *keep_running_00;
  Am_Value_List *this;
  bool keep_running;
  Am_Value_List values;
  Am_Value_List value2s;
  Am_Value curr_value;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Value_List result;
  Am_Value_List steps;
  Am_Value value2;
  Am_Value_List local_60;
  Am_Value step_size;
  Am_Value local_40;
  
  pAVar2 = Am_Time::operator_cast_to_Am_Wrapper_(elapsed_time);
  Am_Object::Set(interp,0xea,pAVar2,0);
  uVar3 = Am_Time::Milliseconds(elapsed_time);
  if (uVar3 != 0) {
    pAVar4 = Am_Object::Get(interp,0x169,0);
    Am_Value::Am_Value(&curr_value,pAVar4);
    pAVar4 = Am_Object::Get(interp,0x183,0);
    Am_Value::Am_Value(&step_size,pAVar4);
    pAVar4 = Am_Object::Get(interp,0x182,0);
    Am_Value::Am_Value(&value2,pAVar4);
    bVar1 = Am_Value_List::Test(&curr_value);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&values,&curr_value);
      Am_Value_List::Am_Value_List(&steps,&step_size);
      bVar1 = Am_Value::Exists(&value2);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&value2s,&value2);
        Am_Value_List::Am_Value_List(&result);
        Am_Value_List::Start(&values);
        Am_Value_List::Start(&steps);
        Am_Value_List::Start(&value2s);
        while (((bVar1 = Am_Value_List::Last(&values), !bVar1 &&
                (bVar1 = Am_Value_List::Last(&steps), !bVar1)) &&
               (bVar1 = Am_Value_List::Last(&value2s), !bVar1))) {
          pAVar4 = Am_Value_List::Get(&values);
          pAVar5 = Am_Value_List::Get(&steps);
          keep_running_00 = Am_Value_List::Get(&value2s);
          step_1D(&local_40,pAVar4,pAVar5,(bool *)keep_running_00);
          Am_Value_List::Add(&result,&local_40,Am_TAIL,true);
          Am_Value::~Am_Value(&local_40);
          Am_Value_List::Next(&values);
          Am_Value_List::Next(&steps);
          Am_Value_List::Next(&value2s);
        }
        pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&result);
        Am_Value::Am_Value((Am_Value *)&local_60,pAVar2);
        Am_Value_List::~Am_Value_List(&result);
      }
      else {
        Am_Value_List::Am_Value_List(&value2s);
        Am_Value_List::Start(&values);
        Am_Value_List::Start(&steps);
        while ((bVar1 = Am_Value_List::Last(&values), !bVar1 &&
               (bVar1 = Am_Value_List::Last(&steps), !bVar1))) {
          pAVar4 = Am_Value_List::Get(&values);
          pAVar5 = Am_Value_List::Get(&steps);
          step_1D((Am_Value *)&result,pAVar4,pAVar5,(bool *)&Am_No_Value);
          Am_Value_List::Add(&value2s,(Am_Value *)&result,Am_TAIL,true);
          Am_Value::~Am_Value((Am_Value *)&result);
          Am_Value_List::Next(&values);
          Am_Value_List::Next(&steps);
        }
        pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&value2s);
        Am_Value::Am_Value((Am_Value *)&local_60,pAVar2);
      }
      Am_Value_List::~Am_Value_List(&value2s);
      Am_Value_List::~Am_Value_List(&steps);
      Am_Value_List::~Am_Value_List(&values);
      Am_Value::operator=(&curr_value,(Am_Value *)&local_60);
      this = &local_60;
    }
    else {
      step_1D((Am_Value *)&values,&curr_value,&step_size,(bool *)&value2);
      Am_Value::operator=(&curr_value,(Am_Value *)&values);
      this = &values;
    }
    Am_Value::~Am_Value((Am_Value *)this);
    Am_Object::Set(interp,0x169,&curr_value,0);
    pAVar4 = Am_Object::Get(interp,200,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)&values,pAVar4);
    if (values.item != (Am_List_Item *)0x0) {
      Am_Object::Am_Object(&local_98,interp);
      (*(code *)values.item)(&local_98);
      Am_Object::~Am_Object(&local_98);
    }
    Am_Object::Am_Object(&local_a0,interp);
    Am_Set_Animated_Slots(&local_a0);
    Am_Object::~Am_Object(&local_a0);
    Am_Value::~Am_Value(&value2);
    Am_Value::~Am_Value(&step_size);
    Am_Value::~Am_Value(&curr_value);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, Am_Stepping_Animator_Animation,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  interp.Set(Am_ELAPSED_TIME, elapsed_time);
  if (elapsed_time.Milliseconds() == 0)
    return;

  Am_Value curr_value = interp.Get(Am_VALUE);
  Am_Value step_size = interp.Get(Am_SMALL_INCREMENT);
  Am_Value value2 = interp.Get(Am_VALUE_2);

  bool keep_running = false;
  if (Am_Value_List::Test(curr_value))
    curr_value = step_ND(curr_value, step_size, value2, keep_running);
  else
    curr_value = step_1D(curr_value, step_size, value2, keep_running);

  Am_INTER_TRACE_PRINT(interp, "Stepper Animation " << interp << " new value "
                                                    << curr_value);

  interp.Set(Am_VALUE, curr_value);

  if (!keep_running) {
    Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  }

  Am_Set_Animated_Slots(interp);
}